

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SccLiveness.h
# Opt level: O3

void __thiscall SCCLiveness::SCCLiveness(SCCLiveness *this,Func *func,JitArenaAllocator *tempAlloc)

{
  SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount> *pSVar1;
  
  this->func = func;
  this->tempAlloc = tempAlloc;
  this->curLoop = (Loop *)0x0;
  this->lastCall = 0;
  this->lastNonOpHelperCall = 0;
  this->loopNest = 0;
  this->lastOpHelperLabel = (LabelInstr *)0x0;
  this->curRegion = (Region *)0x0;
  (this->lifetimeList).super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)&this->lifetimeList;
  (this->lifetimeList).super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>.
  super_RealCount.count = 0;
  (this->lifetimeList).allocator = &tempAlloc->super_ArenaAllocator;
  (this->opHelperBlockList).super_SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount>.
  super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)&this->opHelperBlockList;
  (this->opHelperBlockList).super_SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount>.
  super_RealCount.count = 0;
  (this->opHelperBlockList).allocator = &tempAlloc->super_ArenaAllocator;
  this->totalOpHelperFullVisitedLength = 0;
  pSVar1 = (SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount> *)
           new<Memory::JitArenaAllocator>(0x10,tempAlloc,0x3eba5c);
  (pSVar1->super_SListNodeBase<Memory::ArenaAllocator>).next = (Type)pSVar1;
  (pSVar1->super_RealCount).count = 0;
  this->extendedLifetimesLoopList = pSVar1;
  return;
}

Assistant:

SCCLiveness(Func *func, JitArenaAllocator *tempAlloc) : func(func),
        tempAlloc(tempAlloc), loopNest(0), lastCall(0), lastNonOpHelperCall(0),
        curLoop(NULL), lastOpHelperLabel(NULL), opHelperBlockList(tempAlloc),
        curRegion(NULL), lifetimeList(tempAlloc),
        totalOpHelperFullVisitedLength(0)
    {
        extendedLifetimesLoopList = JitAnew(tempAlloc, SListBase<Loop *>);
    }